

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O2

void __thiscall
BeliefSetNonStationary::BeliefSetNonStationary(BeliefSetNonStationary *this,size_t nrTimeSteps)

{
  E *this_00;
  allocator_type local_19;
  
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::vector(&this->_m_beliefSets,nrTimeSteps + 1,&local_19);
  if (nrTimeSteps != 999999) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"BeliefSetNonStationary does not make sense in infinite-horizon setting");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

BeliefSetNonStationary::BeliefSetNonStationary(size_t nrTimeSteps) :
    _m_beliefSets(nrTimeSteps+1)
{
    if(nrTimeSteps==MAXHORIZON)
        throw(E("BeliefSetNonStationary does not make sense in infinite-horizon setting"));
}